

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int pigpio_notify(int pi)

{
  ssize_t sVar1;
  int in_EDI;
  cmdCmd_t cmd;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  int local_c;
  int local_8;
  int local_4;
  
  if (((in_EDI < 0) || (0x1f < in_EDI)) || (gPiInUse[in_EDI] == 0)) {
    local_4 = -0x7db;
  }
  else {
    local_18 = 99;
    local_14 = 0;
    local_10 = 0;
    local_c = 0;
    local_8 = in_EDI;
    _pml(0);
    sVar1 = send(gPigNotify[local_8],&local_18,0x10,0);
    if (sVar1 == 0x10) {
      sVar1 = recv(gPigNotify[local_8],&local_18,0x10,0x100);
      if (sVar1 == 0x10) {
        _pmu(0);
        local_4 = local_c;
      }
      else {
        _pmu(0);
        local_4 = -0x7d1;
      }
    }
    else {
      _pmu(0);
      local_4 = -2000;
    }
  }
  return local_4;
}

Assistant:

static int pigpio_notify(int pi)
{
   cmdCmd_t cmd;

   if ((pi < 0) || (pi >= MAX_PI) || !gPiInUse[pi])
      return pigif_unconnected_pi;

   cmd.cmd = PI_CMD_NOIB;
   cmd.p1  = 0;
   cmd.p2  = 0;
   cmd.res = 0;

   _pml(pi);

   if (send(gPigNotify[pi], &cmd, sizeof(cmd), 0) != sizeof(cmd))
   {
      _pmu(pi);
      return pigif_bad_send;
   }

   if (recv(gPigNotify[pi], &cmd, sizeof(cmd), MSG_WAITALL) != sizeof(cmd))
   {
      _pmu(pi);
      return pigif_bad_recv;
   }

   _pmu(pi);

   return cmd.res;
}